

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O0

void Nf_ManElaBestMatchOne
               (Nf_Man_t *p,int iObj,int c,int *pCut,int *pCutSet,Nf_Mat_t *pRes,int Required)

{
  Vec_Wec_t *p_00;
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  Nf_Cfg_t NVar5;
  uint uVar6;
  int *piVar7;
  Vec_Int_t *p_01;
  Nf_Obj_t *pNVar8;
  Mio_Cell2_t *pMVar9;
  word wVar10;
  int local_d8;
  int Delay;
  int fCompl;
  Mio_Cell2_t *pC;
  Nf_Cfg_t Cfg;
  int Const;
  Nf_Obj_t *pBestF [6];
  int fComplF;
  int iFanin;
  int Offset;
  int Info;
  int k;
  int i;
  Vec_Int_t *vArr;
  int fComplExt;
  int iFuncLit;
  int nFans;
  int *pFans;
  Nf_Mat_t *pMd;
  Nf_Mat_t *pMb;
  Nf_Mat_t Mb;
  Nf_Mat_t *pRes_local;
  int *pCutSet_local;
  int *pCut_local;
  int c_local;
  int iObj_local;
  Nf_Man_t *p_local;
  
  Mb._8_8_ = pRes;
  piVar7 = Nf_CutLeaves(pCut);
  uVar1 = Nf_CutSize(pCut);
  iVar2 = Nf_CutFunc(pCut);
  uVar3 = Abc_LitIsCompl(iVar2);
  p_00 = p->vTt2Match;
  iVar4 = Abc_Lit2Var(iVar2);
  p_01 = Vec_WecEntry(p_00,iVar4);
  for (Info = 0; Info < (int)uVar1; Info = Info + 1) {
    pNVar8 = Nf_ManObj(p,piVar7[Info]);
    *(Nf_Obj_t **)(&stack0xffffffffffffff48 + (long)Info * 8) = pNVar8;
  }
  memset((Nf_Mat_t *)&pMb,0,0x10);
  Mb._0_4_ = 0x3fffffff;
  Mb.Cfg = (Nf_Cfg_t)0x7f7fffff;
  if (uVar1 == 0) {
    if ((iVar2 != 0) && (iVar2 != 1)) {
      __assert_fail("iFuncLit == 0 || iFuncLit == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                    ,0x6f4,
                    "void Nf_ManElaBestMatchOne(Nf_Man_t *, int, int, int *, int *, Nf_Mat_t *, int)"
                   );
    }
    Mb._0_4_ = 0;
    Mb.Cfg = (Nf_Cfg_t)p->pCells[(int)(c ^ (uint)(iVar2 == 1))].AreaF;
    uVar1 = Nf_CutHandle(pCutSet,pCut);
    pMb._0_4_ = (uint)pMb & 0xc0000000 | (uVar1 & 0x3ff) << 0x14 |
                (c ^ (uint)(iVar2 == 1)) & 0xfffff;
    NVar5 = Nf_Int2Cfg(0);
    if (((float)Mb.Cfg + 0.001 < *(float *)(Mb._8_8_ + 0xc)) ||
       (((float)Mb.Cfg - 0.001 < *(float *)(Mb._8_8_ + 0xc) &&
        ((int)Mb._0_4_ < *(int *)(Mb._8_8_ + 8))))) {
      *(ulong *)Mb._8_8_ = CONCAT44(NVar5,(uint)pMb) & 0xffffffff7fffffff | 0x80000000;
      *(ulong *)(Mb._8_8_ + 8) = CONCAT44(Mb.Cfg,Mb._0_4_);
    }
  }
  else {
    for (Info = 0; iVar2 = Vec_IntSize(p_01), Info + 1 < iVar2; Info = Info + 2) {
      iVar2 = Vec_IntEntry(p_01,Info);
      iVar4 = Vec_IntEntry(p_01,Info + 1);
      NVar5 = Nf_Int2Cfg(iVar4);
      pMVar9 = Nf_ManCell(p,iVar2);
      local_d8 = 0;
      if (uVar1 != *(uint *)&pMVar9->field_0x10 >> 0x1c) {
        __assert_fail("nFans == (int)pC->nFanins",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                      ,0x708,
                      "void Nf_ManElaBestMatchOne(Nf_Man_t *, int, int, int *, int *, Nf_Mat_t *, int)"
                     );
      }
      if (((uint)NVar5 & 1 ^ uVar3) == c) {
        for (Offset = 0; Offset < (int)uVar1; Offset = Offset + 1) {
          pBestF[5]._4_4_ = Nf_CfgVar(NVar5,Offset);
          pBestF[5]._0_4_ = Nf_CfgCompl(NVar5,Offset);
          piVar7 = (int *)(*(long *)(&stack0xffffffffffffff48 + (long)pBestF[5]._4_4_ * 8) +
                          (long)(int)pBestF[5] * 0x20);
          if (-1 < *piVar7) {
            __assert_fail("pMd->fBest",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                          ,0x70e,
                          "void Nf_ManElaBestMatchOne(Nf_Man_t *, int, int, int *, int *, Nf_Mat_t *, int)"
                         );
          }
          local_d8 = Abc_MaxInt(local_d8,piVar7[2] + pMVar9->iDelays[Offset]);
          if (Required < local_d8) break;
        }
        if ((int)uVar1 <= Offset) {
          Mb._0_4_ = local_d8;
          Mb.Cfg = (Nf_Cfg_t)0x7f7fffff;
          pMb._0_4_ = (uint)pMb & 0x3fffffff | 0x80000000;
          uVar6 = Nf_CutHandle(pCutSet,pCut);
          pMb._0_4_ = (uint)pMb & 0xc0000000 | (uVar6 & 0x3ff) << 0x14 |
                      *(uint *)&pMVar9->field_0x10 & 0xfffff;
          pMb._4_4_ = (uint)NVar5 & 0xfffffffe;
          wVar10 = Nf_MatchRefArea(p,iObj,c,(Nf_Mat_t *)&pMb,Required);
          Mb.Cfg = (Nf_Cfg_t)Scl_Int2Flt((int)wVar10);
          if (((float)Mb.Cfg + 0.001 < *(float *)(Mb._8_8_ + 0xc)) ||
             (((float)Mb.Cfg - 0.001 < *(float *)(Mb._8_8_ + 0xc) &&
              ((int)Mb._0_4_ < *(int *)(Mb._8_8_ + 8))))) {
            *(ulong *)Mb._8_8_ = CONCAT44(pMb._4_4_,(uint)pMb);
            *(ulong *)(Mb._8_8_ + 8) = CONCAT44(Mb.Cfg,Mb._0_4_);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void Nf_ManElaBestMatchOne( Nf_Man_t * p, int iObj, int c, int * pCut, int * pCutSet, Nf_Mat_t * pRes, int Required )
{
    Nf_Mat_t Mb,*pMb = &Mb, * pMd;
    int * pFans      = Nf_CutLeaves(pCut);
    int nFans        = Nf_CutSize(pCut);
    int iFuncLit     = Nf_CutFunc(pCut);
    int fComplExt    = Abc_LitIsCompl(iFuncLit);
    Vec_Int_t * vArr = Vec_WecEntry( p->vTt2Match, Abc_Lit2Var(iFuncLit) );
    int i, k, Info, Offset, iFanin, fComplF;
    // assign fanins matches
    Nf_Obj_t * pBestF[NF_LEAF_MAX];
    for ( i = 0; i < nFans; i++ )
        pBestF[i] = Nf_ManObj( p, pFans[i] );
    // consider matches of this function
    memset( pMb, 0, sizeof(Nf_Mat_t) );
    pMb->D = SCL_INFINITY; pMb->F = FLT_MAX;
    // special cases
    if ( nFans == 0 )
    {
        int Const = (iFuncLit == 1);
        //printf( "Node %d(%d) is const\n", iObj, c );
        assert( iFuncLit == 0 || iFuncLit == 1 );
        pMb->D = 0;
        pMb->F = p->pCells[c ^ Const].AreaF;
        pMb->CutH = Nf_CutHandle(pCutSet, pCut);
        pMb->Gate = c ^ Const;
//        pMb->Conf = 0;
        pMb->Cfg = Nf_Int2Cfg(0);
        pMb->fBest = 1;
        // compare
        if ( pRes->F > pMb->F + NF_EPSILON || (pRes->F > pMb->F - NF_EPSILON && pRes->D > pMb->D) )
            *pRes = *pMb;
        return;
    }
    // consider matches of this function
    Vec_IntForEachEntryDouble( vArr, Info, Offset, i )
    {
        Nf_Cfg_t Cfg   = Nf_Int2Cfg(Offset);
        Mio_Cell2_t*pC = Nf_ManCell( p, Info );
        int fCompl     = Cfg.fCompl ^ fComplExt;
        int Delay      = 0;
        assert( nFans == (int)pC->nFanins );
        if ( fCompl != c )
            continue;
        Nf_CfgForEachVarCompl( Cfg, nFans, iFanin, fComplF, k )
        {
            pMd     = &pBestF[iFanin]->M[fComplF][0];
            assert( pMd->fBest );
            Delay = Abc_MaxInt( Delay, pMd->D + pC->iDelays[k] );
            if ( Delay > Required )
                break;
        }
        if ( k < nFans )
            continue;
        // create match
        pMb->D = Delay;
        pMb->F = FLT_MAX;
        pMb->fBest = 1;
        pMb->fCompl = 0;
        pMb->CutH = Nf_CutHandle(pCutSet, pCut);
        pMb->Gate = pC->Id;
        pMb->Cfg = Cfg;
        pMb->Cfg.fCompl = 0;
        // compute area
        pMb->F = Scl_Int2Flt((int)Nf_MatchRefArea(p, iObj, c, pMb, Required));
        // compare
        if ( pRes->F > pMb->F + NF_EPSILON || (pRes->F > pMb->F - NF_EPSILON && pRes->D > pMb->D) )
            *pRes = *pMb;
    }
}